

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

bool __thiscall libtorrent::aux::torrent::want_peers_finished(torrent *this)

{
  ulong uVar1;
  peer_list *ppVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar5;
  unique_lock<std::mutex> uStack_28;
  
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xc00000000000000) !=
      0x800000000000000) {
    return false;
  }
  uVar1 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if ((uVar1 & 0x9c000000) == 0) {
    uVar5 = (uint)(uVar1 >> 0x20);
    if ((int)(uVar5 >> 1 & 0xffffff) <=
        (int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            .
                            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_torrent_hot_members).m_connections.
                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           .
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) -
        (int)((ulong)((long)(this->m_peers_to_disconnect).
                            super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_peers_to_disconnect).
                           super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      return false;
    }
    uVar5 = uVar5 >> 0x19 & 7;
    if ((((uVar5 != 7) && (uVar5 != 1)) ||
        ((((this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files
         ).m_piece_length < 1)) &&
       ((ppVar2 = (this->super_torrent_hot_members).m_peer_list._M_t.
                  super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                  .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl,
        ppVar2 != (peer_list *)0x0 && (ppVar2->m_num_connect_candidates != 0)))) {
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      uStack_28._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar4) + 0x438);
      uStack_28._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&uStack_28);
      uStack_28._M_owns = true;
      uVar1 = *(ulong *)(CONCAT44(extraout_var,iVar4) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
      if (((uVar1 >> 0x2a & 1) != 0) ||
         ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xc00000000000000) !=
          0x800000000000000)) {
        iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x2e])();
        bVar3 = session_settings::get_bool
                          ((session_settings *)CONCAT44(extraout_var_00,iVar4),0x8022);
        if (!bVar3) {
          iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[0x2e])();
          bVar3 = session_settings::get_bool
                            ((session_settings *)CONCAT44(extraout_var_01,iVar4),0x8020);
          if (!bVar3) {
            return false;
          }
        }
        return true;
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool torrent::want_peers_finished() const
	{
		return (m_state == torrent_status::finished
			|| m_state == torrent_status::seeding)
			&& want_peers();
	}